

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::cmTestGenerator
          (cmTestGenerator *this,cmTest *test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CTEST_CONFIGURATION_TYPE","")
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,configurations);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_58,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmTestGenerator_009a06d0;
  this->Test = test;
  (this->super_cmScriptGenerator).ActionsPerConfig = (bool)(test->OldStyle ^ 1);
  this->TestGenerated = false;
  this->LG = (cmLocalGenerator *)0x0;
  return;
}

Assistant:

cmTestGenerator::cmTestGenerator(
  cmTest* test, std::vector<std::string> const& configurations)
  : cmScriptGenerator("CTEST_CONFIGURATION_TYPE", configurations)
  , Test(test)
{
  this->ActionsPerConfig = !test->GetOldStyle();
  this->TestGenerated = false;
  this->LG = nullptr;
}